

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::DirtyAbsoluteOffsetRecursive(Element *this)

{
  pointer puVar1;
  ulong uVar2;
  
  if ((this->absolute_offset_dirty == false) &&
     (this->absolute_offset_dirty = true,
     (this->transform_state)._M_t.
     super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>._M_t.
     super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
     super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl != (TransformState *)0x0)) {
    this->field_0x17 = this->field_0x17 | 0x60;
  }
  puVar1 = (this->children).
           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
    uVar2 = 0;
    do {
      DirtyAbsoluteOffsetRecursive
                (puVar1[uVar2]._M_t.
                 super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                 super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
      uVar2 = uVar2 + 1;
      puVar1 = (this->children).
               super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->children).
                                   super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3));
  }
  return;
}

Assistant:

void Element::DirtyAbsoluteOffsetRecursive()
{
	if (!absolute_offset_dirty)
	{
		absolute_offset_dirty = true;

		if (transform_state)
			DirtyTransformState(true, true);
	}

	for (size_t i = 0; i < children.size(); i++)
		children[i]->DirtyAbsoluteOffsetRecursive();
}